

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input-xkb.c
# Opt level: O0

uint32_t wpe_input_xkb_context_get_key_code
                   (wpe_input_xkb_context *xkb_context,uint32_t hardware_key_code,_Bool pressed)

{
  int iVar1;
  undefined4 uVar2;
  uint32_t sym;
  _Bool pressed_local;
  uint32_t hardware_key_code_local;
  wpe_input_xkb_context *xkb_context_local;
  
  wpe_input_xkb_context_try_ensure_keymap(xkb_context);
  if (xkb_context->state == (xkb_state *)0x0) {
    xkb_context_local._4_4_ = 0;
  }
  else {
    xkb_context_local._4_4_ = xkb_state_key_get_one_sym(xkb_context->state,hardware_key_code);
    if (((pressed) &&
        (wpe_input_xkb_context_try_ensure_compose_table(xkb_context),
        xkb_context->compose_state != (xkb_compose_state *)0x0)) &&
       (iVar1 = xkb_compose_state_feed(xkb_context->compose_state,xkb_context_local._4_4_),
       iVar1 == 1)) {
      uVar2 = xkb_compose_state_get_status(xkb_context->compose_state);
      switch(uVar2) {
      case 0:
        break;
      case 1:
      case 3:
        xkb_context_local._4_4_ = 0;
        break;
      case 2:
        xkb_context_local._4_4_ = xkb_compose_state_get_one_sym(xkb_context->compose_state);
      }
    }
  }
  return xkb_context_local._4_4_;
}

Assistant:

uint32_t
wpe_input_xkb_context_get_key_code(struct wpe_input_xkb_context* xkb_context, uint32_t hardware_key_code, bool pressed)
{
    wpe_input_xkb_context_try_ensure_keymap(xkb_context);
    if (!xkb_context->state)
        return 0;

    uint32_t sym = xkb_state_key_get_one_sym(xkb_context->state, hardware_key_code);
    if (!pressed)
        return sym;

    wpe_input_xkb_context_try_ensure_compose_table(xkb_context);
    if (!xkb_context->compose_state)
        return sym;

    if (xkb_compose_state_feed(xkb_context->compose_state, sym) != XKB_COMPOSE_FEED_ACCEPTED)
        return sym;

    switch (xkb_compose_state_get_status(xkb_context->compose_state)) {
    case XKB_COMPOSE_COMPOSING:
    case XKB_COMPOSE_CANCELLED:
        return 0;
    case XKB_COMPOSE_COMPOSED:
        return xkb_compose_state_get_one_sym(xkb_context->compose_state);
    case XKB_COMPOSE_NOTHING:
    default:
        break;
    }

    return sym;
}